

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  BVH *bvh;
  NodeRef root;
  RayK<8> *pRVar2;
  size_t k;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [12];
  int iVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  size_t *psVar70;
  ulong uVar71;
  undefined1 (*pauVar72) [32];
  RayK<8> *pRVar73;
  long lVar74;
  ulong uVar75;
  undefined4 uVar76;
  RayK<8> *unaff_R15;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar87 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  float fVar93;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar111;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar120;
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar129;
  float fVar130;
  undefined1 auVar131 [16];
  uint uVar136;
  float fVar137;
  uint uVar138;
  float fVar139;
  float fVar141;
  uint uVar142;
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar140;
  uint uVar148;
  undefined1 auVar135 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar159;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar160;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar170;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d01;
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  RayK<8> *local_5ca0;
  Intersectors *local_5c98;
  RayK<8> *local_5c90;
  RayQueryContext *local_5c88;
  undefined1 local_5c80 [20];
  uint uStack_5c6c;
  uint uStack_5c68;
  uint uStack_5c64;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  float fStack_5c44;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bb0 [16];
  undefined1 local_5ba0 [16];
  undefined1 local_5b90 [16];
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  float fStack_5ac4;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a60;
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [8];
  float fStack_5998;
  float fStack_5994;
  float fStack_5990;
  float fStack_598c;
  float fStack_5988;
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar149 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar155 = vpcmpeqd_avx(auVar149,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar149 = vpcmpeqd_avx(auVar149,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar86 = ZEXT816(0) << 0x40;
      auVar95 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar86),5);
      auVar116._16_16_ = auVar149;
      auVar116._0_16_ = auVar155;
      auVar88 = auVar116 & auVar95;
      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0x7f,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar88 >> 0xbf,0) != '\0') ||
          (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar88[0x1f] < '\0') {
        local_5880 = vandps_avx(auVar95,auVar116);
        local_5a60._0_8_ = *(undefined8 *)ray;
        local_5a60._8_8_ = *(undefined8 *)(ray + 8);
        local_5a60._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5a60._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5a60._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5a60._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5a60._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5a60._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5a60._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5a60._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5a60._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5a60._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5a00 = *(undefined1 (*) [32])(ray + 0x80);
        local_59e0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar157._8_4_ = 0x7fffffff;
        auVar157._0_8_ = 0x7fffffff7fffffff;
        auVar157._12_4_ = 0x7fffffff;
        auVar157._16_4_ = 0x7fffffff;
        auVar157._20_4_ = 0x7fffffff;
        auVar157._24_4_ = 0x7fffffff;
        auVar157._28_4_ = 0x7fffffff;
        auVar132._8_4_ = 0x219392ef;
        auVar132._0_8_ = 0x219392ef219392ef;
        auVar132._12_4_ = 0x219392ef;
        auVar132._16_4_ = 0x219392ef;
        auVar132._20_4_ = 0x219392ef;
        auVar132._24_4_ = 0x219392ef;
        auVar132._28_4_ = 0x219392ef;
        auVar95 = vandps_avx(auVar157,local_5a00);
        auVar95 = vcmpps_avx(auVar95,auVar132,1);
        auVar88 = vblendvps_avx(local_5a00,auVar132,auVar95);
        auVar95 = vandps_avx(auVar157,local_59e0);
        auVar95 = vcmpps_avx(auVar95,auVar132,1);
        auVar116 = vblendvps_avx(local_59e0,auVar132,auVar95);
        auVar95 = vandps_avx(auVar157,local_59c0);
        auVar95 = vcmpps_avx(auVar95,auVar132,1);
        auVar95 = vblendvps_avx(local_59c0,auVar132,auVar95);
        auVar20 = vrcpps_avx(auVar88);
        fVar3 = auVar20._0_4_;
        fVar4 = auVar20._4_4_;
        auVar21._4_4_ = auVar88._4_4_ * fVar4;
        auVar21._0_4_ = auVar88._0_4_ * fVar3;
        fVar5 = auVar20._8_4_;
        auVar21._8_4_ = auVar88._8_4_ * fVar5;
        fVar8 = auVar20._12_4_;
        auVar21._12_4_ = auVar88._12_4_ * fVar8;
        fVar11 = auVar20._16_4_;
        auVar21._16_4_ = auVar88._16_4_ * fVar11;
        fVar14 = auVar20._20_4_;
        auVar21._20_4_ = auVar88._20_4_ * fVar14;
        fVar16 = auVar20._24_4_;
        auVar21._24_4_ = auVar88._24_4_ * fVar16;
        auVar21._28_4_ = auVar88._28_4_;
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = &DAT_3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar150._16_4_ = 0x3f800000;
        auVar150._20_4_ = 0x3f800000;
        auVar150._24_4_ = 0x3f800000;
        auVar150._28_4_ = 0x3f800000;
        auVar88 = vsubps_avx(auVar150,auVar21);
        local_59a0._0_4_ = fVar3 + fVar3 * auVar88._0_4_;
        local_59a0._4_4_ = fVar4 + fVar4 * auVar88._4_4_;
        fStack_5998 = fVar5 + fVar5 * auVar88._8_4_;
        fStack_5994 = fVar8 + fVar8 * auVar88._12_4_;
        fStack_5990 = fVar11 + fVar11 * auVar88._16_4_;
        fStack_598c = fVar14 + fVar14 * auVar88._20_4_;
        fStack_5988 = fVar16 + fVar16 * auVar88._24_4_;
        register0x0000129c = auVar20._28_4_ + auVar88._28_4_;
        auVar88 = vrcpps_avx(auVar116);
        fVar3 = auVar88._0_4_;
        fVar4 = auVar88._4_4_;
        auVar20._4_4_ = auVar116._4_4_ * fVar4;
        auVar20._0_4_ = auVar116._0_4_ * fVar3;
        fVar5 = auVar88._8_4_;
        auVar20._8_4_ = auVar116._8_4_ * fVar5;
        fVar8 = auVar88._12_4_;
        auVar20._12_4_ = auVar116._12_4_ * fVar8;
        fVar11 = auVar88._16_4_;
        auVar20._16_4_ = auVar116._16_4_ * fVar11;
        fVar14 = auVar88._20_4_;
        auVar20._20_4_ = auVar116._20_4_ * fVar14;
        fVar16 = auVar88._24_4_;
        auVar20._24_4_ = auVar116._24_4_ * fVar16;
        auVar20._28_4_ = auVar116._28_4_;
        auVar116 = vsubps_avx(auVar150,auVar20);
        local_5980._0_4_ = fVar3 + fVar3 * auVar116._0_4_;
        local_5980._4_4_ = fVar4 + fVar4 * auVar116._4_4_;
        fStack_5978 = fVar5 + fVar5 * auVar116._8_4_;
        fStack_5974 = fVar8 + fVar8 * auVar116._12_4_;
        fStack_5970 = fVar11 + fVar11 * auVar116._16_4_;
        fStack_596c = fVar14 + fVar14 * auVar116._20_4_;
        fStack_5968 = fVar16 + fVar16 * auVar116._24_4_;
        register0x000012dc = auVar88._28_4_ + auVar116._28_4_;
        auVar88 = vrcpps_avx(auVar95);
        fVar3 = auVar88._0_4_;
        fVar4 = auVar88._4_4_;
        auVar22._4_4_ = auVar95._4_4_ * fVar4;
        auVar22._0_4_ = auVar95._0_4_ * fVar3;
        fVar5 = auVar88._8_4_;
        auVar22._8_4_ = auVar95._8_4_ * fVar5;
        fVar8 = auVar88._12_4_;
        auVar22._12_4_ = auVar95._12_4_ * fVar8;
        fVar11 = auVar88._16_4_;
        auVar22._16_4_ = auVar95._16_4_ * fVar11;
        fVar14 = auVar88._20_4_;
        auVar22._20_4_ = auVar95._20_4_ * fVar14;
        fVar16 = auVar88._24_4_;
        auVar22._24_4_ = auVar95._24_4_ * fVar16;
        auVar22._28_4_ = auVar95._28_4_;
        auVar95 = vsubps_avx(auVar150,auVar22);
        local_5960._0_4_ = fVar3 + fVar3 * auVar95._0_4_;
        local_5960._4_4_ = fVar4 + fVar4 * auVar95._4_4_;
        fStack_5958 = fVar5 + fVar5 * auVar95._8_4_;
        fStack_5954 = fVar8 + fVar8 * auVar95._12_4_;
        fStack_5950 = fVar11 + fVar11 * auVar95._16_4_;
        fStack_594c = fVar14 + fVar14 * auVar95._20_4_;
        fStack_5948 = fVar16 + fVar16 * auVar95._24_4_;
        register0x0000131c = auVar88._28_4_ + auVar95._28_4_;
        auVar88._8_4_ = 0x20;
        auVar88._0_8_ = 0x2000000020;
        auVar88._12_4_ = 0x20;
        auVar88._16_4_ = 0x20;
        auVar88._20_4_ = 0x20;
        auVar88._24_4_ = 0x20;
        auVar88._28_4_ = 0x20;
        auVar95 = vcmpps_avx(_local_59a0,ZEXT1632(auVar86),1);
        local_5940 = vandps_avx(auVar95,auVar88);
        auVar88 = ZEXT1632(auVar86);
        auVar95 = vcmpps_avx(_local_5980,auVar88,5);
        auVar117._8_4_ = 0x40;
        auVar117._0_8_ = 0x4000000040;
        auVar117._12_4_ = 0x40;
        auVar117._16_4_ = 0x40;
        auVar117._20_4_ = 0x40;
        auVar117._24_4_ = 0x40;
        auVar117._28_4_ = 0x40;
        auVar133._8_4_ = 0x60;
        auVar133._0_8_ = 0x6000000060;
        auVar133._12_4_ = 0x60;
        auVar133._16_4_ = 0x60;
        auVar133._20_4_ = 0x60;
        auVar133._24_4_ = 0x60;
        auVar133._28_4_ = 0x60;
        local_5920 = vblendvps_avx(auVar133,auVar117,auVar95);
        auVar95 = vcmpps_avx(_local_5960,auVar88,5);
        auVar118._8_4_ = 0x80;
        auVar118._0_8_ = 0x8000000080;
        auVar118._12_4_ = 0x80;
        auVar118._16_4_ = 0x80;
        auVar118._20_4_ = 0x80;
        auVar118._24_4_ = 0x80;
        auVar118._28_4_ = 0x80;
        auVar122._8_4_ = 0xa0;
        auVar122._0_8_ = 0xa0000000a0;
        auVar122._12_4_ = 0xa0;
        auVar122._16_4_ = 0xa0;
        auVar122._20_4_ = 0xa0;
        auVar122._24_4_ = 0xa0;
        auVar122._28_4_ = 0xa0;
        local_5900 = vblendvps_avx(auVar122,auVar118,auVar95);
        auVar95 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar88);
        auVar88 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar88);
        auVar79._8_4_ = 0x7f800000;
        auVar79._0_8_ = 0x7f8000007f800000;
        auVar79._12_4_ = 0x7f800000;
        auVar79._16_4_ = 0x7f800000;
        auVar79._20_4_ = 0x7f800000;
        auVar79._24_4_ = 0x7f800000;
        auVar79._28_4_ = 0x7f800000;
        local_58e0 = vblendvps_avx(auVar79,auVar95,local_5880);
        auVar95._8_4_ = 0xff800000;
        auVar95._0_8_ = 0xff800000ff800000;
        auVar95._12_4_ = 0xff800000;
        auVar95._16_4_ = 0xff800000;
        auVar95._20_4_ = 0xff800000;
        auVar95._24_4_ = 0xff800000;
        auVar95._28_4_ = 0xff800000;
        local_58c0 = vblendvps_avx(auVar95,auVar88,local_5880);
        auVar95 = vcmpps_avx(local_58c0,local_58c0,0xf);
        local_5c80._4_4_ = local_5880._4_4_ ^ auVar95._4_4_;
        local_5c80._0_4_ = local_5880._0_4_ ^ auVar95._0_4_;
        local_5c80._8_4_ = local_5880._8_4_ ^ auVar95._8_4_;
        local_5c80._12_4_ = local_5880._12_4_ ^ auVar95._12_4_;
        local_5c80._16_4_ = local_5880._16_4_ ^ auVar95._16_4_;
        uStack_5c6c = local_5880._20_4_ ^ auVar95._20_4_;
        uStack_5c68 = local_5880._24_4_ ^ auVar95._24_4_;
        uStack_5c64 = local_5880._28_4_ ^ auVar95._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar75 = 7;
        }
        else {
          uVar75 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5ca0 = ray + 0x100;
        psVar70 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar72 = (undefined1 (*) [32])local_4640;
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        local_5808[0] = (bvh->root).ptr;
        local_4660 = local_58e0;
LAB_0048571a:
        pauVar72 = pauVar72 + -1;
        root.ptr = psVar70[-1];
        psVar70 = psVar70 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_004861b7;
        local_5d00 = *pauVar72;
        auVar108 = ZEXT3264(local_5d00);
        auVar149 = local_5d00._0_16_;
        auVar95 = vcmpps_avx(local_5d00,local_58c0,1);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) {
LAB_004861c8:
          iVar66 = 2;
        }
        else {
          uVar76 = vmovmskps_avx(auVar95);
          unaff_R15 = (RayK<8> *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar76);
          iVar66 = 0;
          if ((uint)POPCOUNT(uVar76) <= uVar75) {
            local_5ce0._0_8_ = uVar75;
            for (; unaff_R15 != (RayK<8> *)0x0;
                unaff_R15 = (RayK<8> *)((ulong)unaff_R15 & (ulong)(unaff_R15 + -1))) {
              k = 0;
              if (unaff_R15 != (RayK<8> *)0x0) {
                for (; ((ulong)unaff_R15 >> k & 1) == 0; k = k + 1) {
                }
              }
              local_5cc0._0_8_ = k;
              auVar108 = ZEXT1664(auVar108._0_16_);
              local_5c98 = This;
              local_5c90 = ray;
              local_5c88 = context;
              bVar77 = occluded1(This,bvh,root,k,&local_5d01,ray,
                                 (TravRayK<8,_false> *)&local_5a60.field_0,context);
              auVar149 = auVar108._0_16_;
              if (bVar77) {
                *(undefined4 *)(local_5c80 + local_5cc0._0_8_ * 4) = 0xffffffff;
              }
              This = local_5c98;
              ray = local_5c90;
              context = local_5c88;
            }
            auVar149 = vpcmpeqd_avx(auVar149,auVar149);
            auVar155 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar149);
            auVar149 = vpcmpgtd_avx(local_5c80._0_16_,auVar149);
            auVar149 = vpor_avx(auVar149,auVar155);
            iVar66 = 3;
            unaff_R15 = (RayK<8> *)0x0;
            uVar75 = local_5ce0._0_8_;
            if ((((auVar149 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar149 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar149 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar149[0xf] < '\0') {
              auVar107._8_4_ = 0xff800000;
              auVar107._0_8_ = 0xff800000ff800000;
              auVar107._12_4_ = 0xff800000;
              auVar107._16_4_ = 0xff800000;
              auVar107._20_4_ = 0xff800000;
              auVar107._24_4_ = 0xff800000;
              auVar107._28_4_ = 0xff800000;
              local_58c0 = vblendvps_avx(local_58c0,auVar107,_local_5c80);
              iVar66 = 2;
            }
          }
          if ((uint)uVar75 < (uint)POPCOUNT(uVar76)) {
            unaff_R15 = (RayK<8> *)0x8;
            do {
              if ((root.ptr & 8) != 0) {
                auVar149 = local_5d00._0_16_;
                if ((RayK<8> *)root.ptr == (RayK<8> *)&DAT_fffffffffffffff8) goto LAB_004861b7;
                auVar95 = vcmpps_avx(local_58c0,local_5d00,6);
                if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar95 >> 0x7f,0) == '\0') &&
                      (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar95 >> 0xbf,0) == '\0') &&
                    (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar95[0x1f]) goto LAB_004861c8;
                local_58a0 = local_58c0;
                uVar67 = (ulong)((uint)root.ptr & 0xf);
                auVar85 = _local_5c80;
                if (uVar67 == 8) goto LAB_00486168;
                auVar99._0_8_ = local_5c80._0_8_ ^ 0xffffffffffffffff;
                auVar99._8_4_ = local_5c80._8_4_ ^ 0xffffffff;
                auVar99._12_4_ = local_5c80._12_4_ ^ 0xffffffff;
                auVar99._16_4_ = local_5c80._16_4_ ^ 0xffffffff;
                auVar99._20_4_ = local_5c80._20_4_ ^ 0xffffffff;
                auVar99._24_4_ = local_5c80._24_4_ ^ 0xffffffff;
                auVar99._28_4_ = local_5c80._28_4_ ^ 0xffffffff;
                local_5a80 = *(undefined8 *)ray;
                uStack_5a78 = *(undefined8 *)(ray + 8);
                uStack_5a70 = *(undefined8 *)(ray + 0x10);
                uStack_5a68 = *(undefined8 *)(ray + 0x18);
                pRVar73 = ray + 0x20;
                local_5aa0 = *(undefined8 *)pRVar73;
                uStack_5a98 = *(undefined8 *)(ray + 0x28);
                uStack_5a90 = *(undefined8 *)(ray + 0x30);
                uStack_5a88 = *(undefined8 *)(ray + 0x38);
                pRVar2 = ray + 0x40;
                local_5ac0 = *(undefined8 *)pRVar2;
                uStack_5ab8 = *(undefined8 *)(ray + 0x48);
                uStack_5ab0 = *(undefined8 *)(ray + 0x50);
                uStack_5aa8 = *(undefined8 *)(ray + 0x58);
                uVar49 = *(undefined8 *)(ray + 0x60);
                uVar50 = *(undefined8 *)(ray + 0x68);
                uVar51 = *(undefined8 *)(ray + 0x70);
                uStack_5b28 = *(undefined8 *)(ray + 0x78);
                uVar52 = *(undefined8 *)(ray + 0xa0);
                auVar65 = *(undefined1 (*) [12])(ray + 0xa0);
                local_5ae0 = (float)uVar52;
                fStack_5adc = (float)((ulong)uVar52 >> 0x20);
                fStack_5ad8 = (float)*(undefined8 *)(ray + 0xa8);
                fStack_5ad4 = (float)((ulong)*(undefined8 *)(ray + 0xa8) >> 0x20);
                fStack_5ad0 = (float)*(undefined8 *)(ray + 0xb0);
                fStack_5acc = (float)((ulong)*(undefined8 *)(ray + 0xb0) >> 0x20);
                fStack_5ac8 = (float)*(undefined8 *)(ray + 0xb8);
                fStack_5ac4 = (float)((ulong)*(undefined8 *)(ray + 0xb8) >> 0x20);
                uVar52 = *(undefined8 *)(ray + 0xc0);
                uVar53 = *(undefined8 *)(ray + 200);
                uVar54 = *(undefined8 *)(ray + 0xd0);
                uStack_5ae8 = *(undefined8 *)(ray + 0xd8);
                uVar55 = *(undefined8 *)(ray + 0x80);
                uVar56 = *(undefined8 *)(ray + 0x88);
                uVar57 = *(undefined8 *)(ray + 0x90);
                uStack_5b08 = *(undefined8 *)(ray + 0x98);
                uVar58 = *(undefined8 *)(ray + 0x100);
                uVar59 = *(undefined8 *)(ray + 0x108);
                uVar60 = *(undefined8 *)(ray + 0x110);
                uStack_5b48 = *(undefined8 *)(ray + 0x118);
                pRVar1 = ray + 0x120;
                local_5b80 = *(undefined8 *)pRVar1;
                uStack_5b78 = *(undefined8 *)(ray + 0x128);
                uStack_5b70 = *(undefined8 *)(ray + 0x130);
                uStack_5b68 = *(undefined8 *)(ray + 0x138);
                lVar74 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar68 = 0;
                local_5ce0 = _local_5c80;
                goto LAB_00485ab9;
              }
              auVar108 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar67 = 0;
              pRVar73 = unaff_R15;
              do {
                pRVar2 = *(RayK<8> **)((root.ptr & 0xfffffffffffffff0) + uVar67 * 8);
                if (pRVar2 != (RayK<8> *)0x8) {
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0x40);
                  auVar80._4_4_ = uVar76;
                  auVar80._0_4_ = uVar76;
                  auVar80._8_4_ = uVar76;
                  auVar80._12_4_ = uVar76;
                  auVar80._16_4_ = uVar76;
                  auVar80._20_4_ = uVar76;
                  auVar80._24_4_ = uVar76;
                  auVar80._28_4_ = uVar76;
                  auVar61._8_8_ = local_5a60._8_8_;
                  auVar61._0_8_ = local_5a60._0_8_;
                  auVar61._16_8_ = local_5a60._16_8_;
                  auVar61._24_8_ = local_5a60._24_8_;
                  auVar62._8_8_ = local_5a60._40_8_;
                  auVar62._0_8_ = local_5a60._32_8_;
                  auVar62._16_8_ = local_5a60._48_8_;
                  auVar62._24_8_ = local_5a60._56_8_;
                  auVar63._8_8_ = local_5a60._72_8_;
                  auVar63._0_8_ = local_5a60._64_8_;
                  auVar63._16_8_ = local_5a60._80_8_;
                  auVar63._24_8_ = local_5a60._88_8_;
                  auVar95 = vsubps_avx(auVar80,auVar61);
                  auVar78._0_4_ = (float)local_59a0._0_4_ * auVar95._0_4_;
                  auVar78._4_4_ = (float)local_59a0._4_4_ * auVar95._4_4_;
                  auVar78._8_4_ = fStack_5998 * auVar95._8_4_;
                  auVar78._12_4_ = fStack_5994 * auVar95._12_4_;
                  auVar23._16_4_ = fStack_5990 * auVar95._16_4_;
                  auVar23._0_16_ = auVar78;
                  auVar23._20_4_ = fStack_598c * auVar95._20_4_;
                  auVar23._24_4_ = fStack_5988 * auVar95._24_4_;
                  auVar23._28_4_ = auVar95._28_4_;
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0x80);
                  auVar89._4_4_ = uVar76;
                  auVar89._0_4_ = uVar76;
                  auVar89._8_4_ = uVar76;
                  auVar89._12_4_ = uVar76;
                  auVar89._16_4_ = uVar76;
                  auVar89._20_4_ = uVar76;
                  auVar89._24_4_ = uVar76;
                  auVar89._28_4_ = uVar76;
                  auVar95 = vsubps_avx(auVar89,auVar62);
                  auVar87._0_4_ = (float)local_5980._0_4_ * auVar95._0_4_;
                  auVar87._4_4_ = (float)local_5980._4_4_ * auVar95._4_4_;
                  auVar87._8_4_ = fStack_5978 * auVar95._8_4_;
                  auVar87._12_4_ = fStack_5974 * auVar95._12_4_;
                  auVar24._16_4_ = fStack_5970 * auVar95._16_4_;
                  auVar24._0_16_ = auVar87;
                  auVar24._20_4_ = fStack_596c * auVar95._20_4_;
                  auVar24._24_4_ = fStack_5968 * auVar95._24_4_;
                  auVar24._28_4_ = auVar95._28_4_;
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0xc0);
                  auVar96._4_4_ = uVar76;
                  auVar96._0_4_ = uVar76;
                  auVar96._8_4_ = uVar76;
                  auVar96._12_4_ = uVar76;
                  auVar96._16_4_ = uVar76;
                  auVar96._20_4_ = uVar76;
                  auVar96._24_4_ = uVar76;
                  auVar96._28_4_ = uVar76;
                  auVar95 = vsubps_avx(auVar96,auVar63);
                  auVar94._0_4_ = (float)local_5960._0_4_ * auVar95._0_4_;
                  auVar94._4_4_ = (float)local_5960._4_4_ * auVar95._4_4_;
                  auVar94._8_4_ = fStack_5958 * auVar95._8_4_;
                  auVar94._12_4_ = fStack_5954 * auVar95._12_4_;
                  auVar25._16_4_ = fStack_5950 * auVar95._16_4_;
                  auVar25._0_16_ = auVar94;
                  auVar25._20_4_ = fStack_594c * auVar95._20_4_;
                  auVar25._24_4_ = fStack_5948 * auVar95._24_4_;
                  auVar25._28_4_ = auVar95._28_4_;
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0x60);
                  auVar161._4_4_ = uVar76;
                  auVar161._0_4_ = uVar76;
                  auVar161._8_4_ = uVar76;
                  auVar161._12_4_ = uVar76;
                  auVar161._16_4_ = uVar76;
                  auVar161._20_4_ = uVar76;
                  auVar161._24_4_ = uVar76;
                  auVar161._28_4_ = uVar76;
                  auVar95 = vsubps_avx(auVar161,auVar61);
                  auVar115._0_4_ = (float)local_59a0._0_4_ * auVar95._0_4_;
                  auVar115._4_4_ = (float)local_59a0._4_4_ * auVar95._4_4_;
                  auVar115._8_4_ = fStack_5998 * auVar95._8_4_;
                  auVar115._12_4_ = fStack_5994 * auVar95._12_4_;
                  auVar26._16_4_ = fStack_5990 * auVar95._16_4_;
                  auVar26._0_16_ = auVar115;
                  auVar26._20_4_ = fStack_598c * auVar95._20_4_;
                  auVar26._24_4_ = fStack_5988 * auVar95._24_4_;
                  auVar26._28_4_ = auVar95._28_4_;
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0xa0);
                  auVar151._4_4_ = uVar76;
                  auVar151._0_4_ = uVar76;
                  auVar151._8_4_ = uVar76;
                  auVar151._12_4_ = uVar76;
                  auVar151._16_4_ = uVar76;
                  auVar151._20_4_ = uVar76;
                  auVar151._24_4_ = uVar76;
                  auVar151._28_4_ = uVar76;
                  auVar95 = vsubps_avx(auVar151,auVar62);
                  auVar121._0_4_ = (float)local_5980._0_4_ * auVar95._0_4_;
                  auVar121._4_4_ = (float)local_5980._4_4_ * auVar95._4_4_;
                  auVar121._8_4_ = fStack_5978 * auVar95._8_4_;
                  auVar121._12_4_ = fStack_5974 * auVar95._12_4_;
                  auVar27._16_4_ = fStack_5970 * auVar95._16_4_;
                  auVar27._0_16_ = auVar121;
                  auVar27._20_4_ = fStack_596c * auVar95._20_4_;
                  auVar27._24_4_ = fStack_5968 * auVar95._24_4_;
                  auVar27._28_4_ = auVar95._28_4_;
                  uVar76 = *(undefined4 *)(root.ptr + uVar67 * 4 + 0xe0);
                  auVar152._4_4_ = uVar76;
                  auVar152._0_4_ = uVar76;
                  auVar152._8_4_ = uVar76;
                  auVar152._12_4_ = uVar76;
                  auVar152._16_4_ = uVar76;
                  auVar152._20_4_ = uVar76;
                  auVar152._24_4_ = uVar76;
                  auVar152._28_4_ = uVar76;
                  auVar95 = vsubps_avx(auVar152,auVar63);
                  auVar131._0_4_ = (float)local_5960._0_4_ * auVar95._0_4_;
                  auVar131._4_4_ = (float)local_5960._4_4_ * auVar95._4_4_;
                  auVar131._8_4_ = fStack_5958 * auVar95._8_4_;
                  auVar131._12_4_ = fStack_5954 * auVar95._12_4_;
                  auVar28._16_4_ = fStack_5950 * auVar95._16_4_;
                  auVar28._0_16_ = auVar131;
                  auVar28._20_4_ = fStack_594c * auVar95._20_4_;
                  auVar28._24_4_ = fStack_5948 * auVar95._24_4_;
                  auVar28._28_4_ = auVar95._28_4_;
                  auVar149 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
                  auVar155 = vpminsd_avx(auVar78,auVar115);
                  auVar86 = vpminsd_avx(auVar24._16_16_,auVar27._16_16_);
                  auVar149 = vpmaxsd_avx(auVar149,auVar86);
                  auVar86 = vpminsd_avx(auVar87,auVar121);
                  auVar155 = vpmaxsd_avx(auVar155,auVar86);
                  auVar86 = vpminsd_avx(auVar94,auVar131);
                  auVar155 = vpmaxsd_avx(auVar155,auVar86);
                  auVar86 = vpminsd_avx(auVar25._16_16_,auVar28._16_16_);
                  auVar149 = vpmaxsd_avx(auVar149,auVar86);
                  auVar86 = vpmaxsd_avx(auVar155,local_58e0._0_16_);
                  auVar18 = vpmaxsd_avx(auVar149,local_58e0._16_16_);
                  auVar19 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
                  auVar78 = vpmaxsd_avx(auVar78,auVar115);
                  auVar115 = vpmaxsd_avx(auVar24._16_16_,auVar27._16_16_);
                  auVar115 = vpminsd_avx(auVar19,auVar115);
                  auVar19 = vpmaxsd_avx(auVar87,auVar121);
                  auVar78 = vpminsd_avx(auVar78,auVar19);
                  auVar19 = vpmaxsd_avx(auVar94,auVar131);
                  auVar78 = vpminsd_avx(auVar78,auVar19);
                  auVar19 = vpmaxsd_avx(auVar25._16_16_,auVar28._16_16_);
                  auVar19 = vpminsd_avx(auVar115,auVar19);
                  auVar78 = vpminsd_avx(auVar78,local_58c0._0_16_);
                  auVar19 = vpminsd_avx(auVar19,local_58c0._16_16_);
                  auVar97._16_16_ = auVar18;
                  auVar97._0_16_ = auVar86;
                  auVar81._16_16_ = auVar19;
                  auVar81._0_16_ = auVar78;
                  auVar95 = vcmpps_avx(auVar97,auVar81,2);
                  if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar95 >> 0x7f,0) == '\0') &&
                        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar95 >> 0xbf,0) == '\0') &&
                      (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar95[0x1f]) {
                    auVar108 = ZEXT3264(auVar108._0_32_);
                  }
                  else {
                    auVar90._16_16_ = auVar149;
                    auVar90._0_16_ = auVar155;
                    auVar88 = vblendps_avx(auVar90,auVar90,0xf0);
                    auVar98._8_4_ = 0x7f800000;
                    auVar98._0_8_ = 0x7f8000007f800000;
                    auVar98._12_4_ = 0x7f800000;
                    auVar98._16_4_ = 0x7f800000;
                    auVar98._20_4_ = 0x7f800000;
                    auVar98._24_4_ = 0x7f800000;
                    auVar98._28_4_ = 0x7f800000;
                    auVar95 = vblendvps_avx(auVar98,auVar88,auVar95);
                    if (pRVar73 != (RayK<8> *)0x8) {
                      *psVar70 = (size_t)pRVar73;
                      psVar70 = psVar70 + 1;
                      *pauVar72 = auVar108._0_32_;
                      pauVar72 = pauVar72 + 1;
                    }
                    auVar108 = ZEXT3264(auVar95);
                    pRVar73 = pRVar2;
                  }
                }
                local_5d00 = auVar108._0_32_;
              } while ((pRVar2 != (RayK<8> *)0x8) &&
                      (bVar77 = uVar67 < 7, uVar67 = uVar67 + 1, bVar77));
              iVar66 = 0;
              if (pRVar73 == (RayK<8> *)0x8) {
LAB_004859b6:
                bVar77 = false;
                iVar66 = 4;
              }
              else {
                auVar95 = vcmpps_avx(local_58c0,local_5d00,6);
                uVar76 = vmovmskps_avx(auVar95);
                bVar77 = true;
                if ((uint)POPCOUNT(uVar76) <= (uint)uVar75) {
                  *psVar70 = (size_t)pRVar73;
                  psVar70 = psVar70 + 1;
                  *pauVar72 = local_5d00;
                  pauVar72 = pauVar72 + 1;
                  goto LAB_004859b6;
                }
              }
              root.ptr = (size_t)pRVar73;
            } while (bVar77);
          }
        }
        goto LAB_004861ba;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar68 = uVar68 + 1;
    lVar74 = lVar74 + 0xe0;
    auVar149 = auVar99._0_16_;
    if (uVar67 - 8 <= uVar68) break;
LAB_00485ab9:
    local_5cc0 = auVar99;
    uVar69 = 0;
    auVar95 = local_5cc0;
    while (uVar71 = (ulong)*(uint *)(lVar74 + uVar69 * 4), uVar71 != 0xffffffff) {
      fVar3 = *(float *)(lVar74 + -0xc0 + uVar69 * 4);
      auVar123._4_4_ = fVar3;
      auVar123._0_4_ = fVar3;
      auVar123._8_4_ = fVar3;
      auVar123._12_4_ = fVar3;
      auVar123._16_4_ = fVar3;
      auVar123._20_4_ = fVar3;
      auVar123._24_4_ = fVar3;
      auVar123._28_4_ = fVar3;
      fVar4 = *(float *)(lVar74 + -0xb0 + uVar69 * 4);
      auVar100._4_4_ = fVar4;
      auVar100._0_4_ = fVar4;
      auVar100._8_4_ = fVar4;
      auVar100._12_4_ = fVar4;
      auVar100._16_4_ = fVar4;
      auVar100._20_4_ = fVar4;
      auVar100._24_4_ = fVar4;
      auVar100._28_4_ = fVar4;
      fVar5 = *(float *)(lVar74 + -0xa0 + uVar69 * 4);
      auVar119._4_4_ = fVar5;
      auVar119._0_4_ = fVar5;
      auVar119._8_4_ = fVar5;
      auVar119._12_4_ = fVar5;
      auVar119._16_4_ = fVar5;
      auVar119._20_4_ = fVar5;
      auVar119._24_4_ = fVar5;
      auVar119._28_4_ = fVar5;
      local_5be0._4_4_ = *(float *)(lVar74 + -0x90 + uVar69 * 4);
      local_5c00._4_4_ = *(float *)(lVar74 + -0x80 + uVar69 * 4);
      local_5c20._4_4_ = *(float *)(lVar74 + -0x70 + uVar69 * 4);
      local_5c40._4_4_ = *(float *)(lVar74 + -0x30 + uVar69 * 4);
      local_5c60._4_4_ = *(float *)(lVar74 + -0x20 + uVar69 * 4);
      local_5840 = *(float *)(lVar74 + -0x10 + uVar69 * 4);
      local_5be0._0_4_ = local_5be0._4_4_;
      fStack_5bd8 = (float)local_5be0._4_4_;
      fStack_5bd4 = (float)local_5be0._4_4_;
      fStack_5bd0 = (float)local_5be0._4_4_;
      fStack_5bcc = (float)local_5be0._4_4_;
      fStack_5bc8 = (float)local_5be0._4_4_;
      fStack_5bc4 = (float)local_5be0._4_4_;
      fVar11 = fVar3 - (float)local_5be0._4_4_;
      local_5c00._0_4_ = local_5c00._4_4_;
      fStack_5bf8 = (float)local_5c00._4_4_;
      fStack_5bf4 = (float)local_5c00._4_4_;
      fStack_5bf0 = (float)local_5c00._4_4_;
      fStack_5bec = (float)local_5c00._4_4_;
      fStack_5be8 = (float)local_5c00._4_4_;
      fStack_5be4 = (float)local_5c00._4_4_;
      fVar156 = fVar4 - (float)local_5c00._4_4_;
      local_5c20._0_4_ = local_5c20._4_4_;
      fStack_5c18 = (float)local_5c20._4_4_;
      fStack_5c14 = (float)local_5c20._4_4_;
      fStack_5c10 = (float)local_5c20._4_4_;
      fStack_5c0c = (float)local_5c20._4_4_;
      fStack_5c08 = (float)local_5c20._4_4_;
      fStack_5c04 = (float)local_5c20._4_4_;
      fVar159 = fVar5 - (float)local_5c20._4_4_;
      local_5c60._0_4_ = local_5c60._4_4_;
      fStack_5c58 = (float)local_5c60._4_4_;
      fStack_5c54 = (float)local_5c60._4_4_;
      fStack_5c50 = (float)local_5c60._4_4_;
      fStack_5c4c = (float)local_5c60._4_4_;
      fStack_5c48 = (float)local_5c60._4_4_;
      fStack_5c44 = (float)local_5c60._4_4_;
      fVar4 = (float)local_5c60._4_4_ - fVar4;
      fVar5 = local_5840 - fVar5;
      local_5c40._0_4_ = local_5c40._4_4_;
      fStack_5c38 = (float)local_5c40._4_4_;
      fStack_5c34 = (float)local_5c40._4_4_;
      fStack_5c30 = (float)local_5c40._4_4_;
      fStack_5c2c = (float)local_5c40._4_4_;
      fStack_5c28 = (float)local_5c40._4_4_;
      fStack_5c24 = (float)local_5c40._4_4_;
      fVar3 = (float)local_5c40._4_4_ - fVar3;
      local_5b90 = ZEXT416((uint)fVar159);
      local_5bb0 = ZEXT416((uint)fVar11);
      local_5ba0 = ZEXT416((uint)fVar156);
      local_5860 = vsubps_avx(auVar100,*(undefined1 (*) [32])pRVar73);
      auVar116 = vsubps_avx(auVar119,*(undefined1 (*) [32])pRVar2);
      fVar8 = auVar116._0_4_;
      fVar113 = auVar65._0_4_;
      auVar162._0_4_ = fVar113 * fVar8;
      fVar14 = auVar116._4_4_;
      fVar114 = auVar65._4_4_;
      auVar162._4_4_ = fVar114 * fVar14;
      fVar6 = auVar116._8_4_;
      fVar130 = auVar65._8_4_;
      auVar162._8_4_ = fVar130 * fVar6;
      fVar9 = auVar116._12_4_;
      auVar162._12_4_ = fStack_5ad4 * fVar9;
      fVar12 = auVar116._16_4_;
      auVar162._16_4_ = fStack_5ad0 * fVar12;
      fVar15 = auVar116._20_4_;
      auVar162._20_4_ = fStack_5acc * fVar15;
      fVar17 = auVar116._24_4_;
      auVar162._24_4_ = fStack_5ac8 * fVar17;
      auVar162._28_4_ = 0;
      local_5b00._0_4_ = (float)uVar52;
      local_5b00._4_4_ = (float)((ulong)uVar52 >> 0x20);
      uStack_5af8._0_4_ = (float)uVar53;
      uStack_5af8._4_4_ = (float)((ulong)uVar53 >> 0x20);
      uStack_5af0._0_4_ = (float)uVar54;
      uStack_5af0._4_4_ = (float)((ulong)uVar54 >> 0x20);
      fVar137 = local_5860._0_4_;
      auVar171._0_4_ = fVar137 * (float)local_5b00;
      fVar139 = local_5860._4_4_;
      auVar171._4_4_ = fVar139 * local_5b00._4_4_;
      fVar141 = local_5860._8_4_;
      auVar171._8_4_ = fVar141 * (float)uStack_5af8;
      fVar143 = local_5860._12_4_;
      auVar171._12_4_ = fVar143 * uStack_5af8._4_4_;
      fVar145 = local_5860._16_4_;
      auVar171._16_4_ = fVar145 * (float)uStack_5af0;
      fVar147 = local_5860._20_4_;
      auVar171._20_4_ = fVar147 * uStack_5af0._4_4_;
      fVar160 = local_5860._24_4_;
      auVar171._24_4_ = fVar160 * (float)uStack_5ae8;
      auVar171._28_4_ = 0;
      auVar20 = vsubps_avx(auVar171,auVar162);
      auVar88 = vsubps_avx(auVar123,*(undefined1 (*) [32])ray);
      fVar120 = auVar88._0_4_;
      fVar124 = auVar88._4_4_;
      auVar29._4_4_ = fVar124 * local_5b00._4_4_;
      auVar29._0_4_ = fVar120 * (float)local_5b00;
      fVar125 = auVar88._8_4_;
      auVar29._8_4_ = fVar125 * (float)uStack_5af8;
      fVar126 = auVar88._12_4_;
      auVar29._12_4_ = fVar126 * uStack_5af8._4_4_;
      fVar127 = auVar88._16_4_;
      auVar29._16_4_ = fVar127 * (float)uStack_5af0;
      fVar128 = auVar88._20_4_;
      auVar29._20_4_ = fVar128 * uStack_5af0._4_4_;
      fVar93 = auVar88._24_4_;
      auVar29._24_4_ = fVar93 * (float)uStack_5ae8;
      auVar29._28_4_ = 0;
      local_5b20._0_4_ = (float)uVar55;
      local_5b20._4_4_ = (float)((ulong)uVar55 >> 0x20);
      uStack_5b18._0_4_ = (float)uVar56;
      uStack_5b18._4_4_ = (float)((ulong)uVar56 >> 0x20);
      uStack_5b10._0_4_ = (float)uVar57;
      uStack_5b10._4_4_ = (float)((ulong)uVar57 >> 0x20);
      auVar30._4_4_ = fVar14 * local_5b20._4_4_;
      auVar30._0_4_ = fVar8 * (float)local_5b20;
      auVar30._8_4_ = fVar6 * (float)uStack_5b18;
      auVar30._12_4_ = fVar9 * uStack_5b18._4_4_;
      auVar30._16_4_ = fVar12 * (float)uStack_5b10;
      auVar30._20_4_ = fVar15 * uStack_5b10._4_4_;
      auVar30._24_4_ = fVar17 * (float)uStack_5b08;
      auVar30._28_4_ = 0;
      auVar21 = vsubps_avx(auVar30,auVar29);
      auVar31._4_4_ = fVar139 * local_5b20._4_4_;
      auVar31._0_4_ = fVar137 * (float)local_5b20;
      auVar31._8_4_ = fVar141 * (float)uStack_5b18;
      auVar31._12_4_ = fVar143 * uStack_5b18._4_4_;
      auVar31._16_4_ = fVar145 * (float)uStack_5b10;
      auVar31._20_4_ = fVar147 * uStack_5b10._4_4_;
      auVar31._24_4_ = fVar160 * (float)uStack_5b08;
      auVar31._28_4_ = 0;
      auVar32._4_4_ = fVar114 * fVar124;
      auVar32._0_4_ = fVar113 * fVar120;
      auVar32._8_4_ = fVar130 * fVar125;
      auVar32._12_4_ = fStack_5ad4 * fVar126;
      auVar32._16_4_ = fStack_5ad0 * fVar127;
      auVar32._20_4_ = fStack_5acc * fVar128;
      fVar13 = local_5860._28_4_;
      auVar32._24_4_ = fStack_5ac8 * fVar93;
      auVar32._28_4_ = fVar13;
      auVar22 = vsubps_avx(auVar32,auVar31);
      auVar149 = ZEXT416((uint)(fVar11 * fVar5 - fVar159 * fVar3));
      auVar149 = vshufps_avx(auVar149,auVar149,0);
      auVar155 = ZEXT416((uint)(fVar156 * fVar3 - fVar11 * fVar4));
      auVar155 = vshufps_avx(auVar155,auVar155,0);
      fVar109 = auVar155._0_4_;
      fVar110 = auVar155._4_4_;
      fVar111 = auVar155._8_4_;
      fVar11 = auVar149._0_4_;
      fVar16 = auVar149._4_4_;
      fVar7 = auVar149._8_4_;
      fVar10 = auVar149._12_4_;
      auVar149 = ZEXT416((uint)(fVar4 * fVar159 - fVar156 * fVar5));
      auVar149 = vshufps_avx(auVar149,auVar149,0);
      fVar156 = auVar149._0_4_;
      fVar159 = auVar149._4_4_;
      fVar112 = auVar149._8_4_;
      auVar187._0_4_ = fVar156 * (float)local_5b20 + fVar109 * (float)local_5b00 + fVar113 * fVar11;
      auVar187._4_4_ = fVar159 * local_5b20._4_4_ + fVar110 * local_5b00._4_4_ + fVar114 * fVar16;
      auVar187._8_4_ = fVar112 * (float)uStack_5b18 + fVar111 * (float)uStack_5af8 + fVar130 * fVar7
      ;
      auVar187._12_4_ =
           auVar149._12_4_ * uStack_5b18._4_4_ +
           auVar155._12_4_ * uStack_5af8._4_4_ + fStack_5ad4 * fVar10;
      auVar187._16_4_ =
           fVar156 * (float)uStack_5b10 + fVar109 * (float)uStack_5af0 + fStack_5ad0 * fVar11;
      auVar187._20_4_ =
           fVar159 * uStack_5b10._4_4_ + fVar110 * uStack_5af0._4_4_ + fStack_5acc * fVar16;
      auVar187._24_4_ =
           fVar112 * (float)uStack_5b08 + fVar111 * (float)uStack_5ae8 + fStack_5ac8 * fVar7;
      auVar187._28_4_ = fVar13 + fVar13 + 0.0;
      auVar86 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar18 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar19 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar134._8_4_ = 0x80000000;
      auVar134._0_8_ = 0x8000000080000000;
      auVar134._12_4_ = 0x80000000;
      auVar134._16_4_ = 0x80000000;
      auVar134._20_4_ = 0x80000000;
      auVar134._24_4_ = 0x80000000;
      auVar134._28_4_ = 0x80000000;
      auVar88 = vandps_avx(auVar187,auVar134);
      uVar129 = auVar88._0_4_;
      auVar188._0_4_ =
           uVar129 ^ (uint)(auVar19._0_4_ * auVar20._0_4_ +
                           auVar18._0_4_ * auVar22._0_4_ + auVar21._0_4_ * auVar86._0_4_);
      uVar136 = auVar88._4_4_;
      auVar188._4_4_ =
           uVar136 ^ (uint)(auVar19._4_4_ * auVar20._4_4_ +
                           auVar18._4_4_ * auVar22._4_4_ + auVar21._4_4_ * auVar86._4_4_);
      uVar138 = auVar88._8_4_;
      auVar188._8_4_ =
           uVar138 ^ (uint)(auVar19._8_4_ * auVar20._8_4_ +
                           auVar18._8_4_ * auVar22._8_4_ + auVar21._8_4_ * auVar86._8_4_);
      uVar140 = auVar88._12_4_;
      auVar188._12_4_ =
           uVar140 ^ (uint)(auVar19._12_4_ * auVar20._12_4_ +
                           auVar18._12_4_ * auVar22._12_4_ + auVar21._12_4_ * auVar86._12_4_);
      uVar142 = auVar88._16_4_;
      auVar188._16_4_ =
           uVar142 ^ (uint)(auVar19._0_4_ * auVar20._16_4_ +
                           auVar18._0_4_ * auVar22._16_4_ + auVar21._16_4_ * auVar86._0_4_);
      uVar144 = auVar88._20_4_;
      auVar188._20_4_ =
           uVar144 ^ (uint)(auVar19._4_4_ * auVar20._20_4_ +
                           auVar18._4_4_ * auVar22._20_4_ + auVar21._20_4_ * auVar86._4_4_);
      uVar146 = auVar88._24_4_;
      auVar188._24_4_ =
           uVar146 ^ (uint)(auVar19._8_4_ * auVar20._24_4_ +
                           auVar18._8_4_ * auVar22._24_4_ + auVar21._24_4_ * auVar86._8_4_);
      uVar148 = auVar88._28_4_;
      auVar188._28_4_ = uVar148 ^ (uint)(auVar19._12_4_ + auVar18._12_4_ + auVar86._12_4_);
      auVar88 = vcmpps_avx(auVar188,_DAT_02020f00,5);
      auVar79 = auVar95 & auVar88;
      local_5b40._0_4_ = (float)uVar49;
      local_5b40._4_4_ = (float)((ulong)uVar49 >> 0x20);
      uStack_5b38._0_4_ = (float)uVar50;
      uStack_5b38._4_4_ = (float)((ulong)uVar50 >> 0x20);
      uStack_5b30._0_4_ = (float)uVar51;
      uStack_5b30._4_4_ = (float)((ulong)uVar51 >> 0x20);
      local_5b60._0_4_ = (float)uVar58;
      local_5b60._4_4_ = (float)((ulong)uVar58 >> 0x20);
      uStack_5b58._0_4_ = (float)uVar59;
      uStack_5b58._4_4_ = (float)((ulong)uVar59 >> 0x20);
      uStack_5b50._0_4_ = (float)uVar60;
      uStack_5b50._4_4_ = (float)((ulong)uVar60 >> 0x20);
      if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar79 >> 0x7f,0) != '\0') ||
            (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar79 >> 0xbf,0) != '\0') ||
          (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar79[0x1f] < '\0') {
        auVar86 = vpermilps_avx(local_5bb0,0);
        auVar18 = vpermilps_avx(local_5ba0,0);
        auVar19 = vpermilps_avx(local_5b90,0);
        auVar88 = vandps_avx(auVar88,auVar95);
        auVar163._0_4_ =
             uVar129 ^ (uint)(auVar20._0_4_ * auVar86._0_4_ +
                             auVar21._0_4_ * auVar18._0_4_ + auVar22._0_4_ * auVar19._0_4_);
        auVar163._4_4_ =
             uVar136 ^ (uint)(auVar20._4_4_ * auVar86._4_4_ +
                             auVar21._4_4_ * auVar18._4_4_ + auVar22._4_4_ * auVar19._4_4_);
        auVar163._8_4_ =
             uVar138 ^ (uint)(auVar20._8_4_ * auVar86._8_4_ +
                             auVar21._8_4_ * auVar18._8_4_ + auVar22._8_4_ * auVar19._8_4_);
        auVar163._12_4_ =
             uVar140 ^ (uint)(auVar20._12_4_ * auVar86._12_4_ +
                             auVar21._12_4_ * auVar18._12_4_ + auVar22._12_4_ * auVar19._12_4_);
        auVar163._16_4_ =
             uVar142 ^ (uint)(auVar20._16_4_ * auVar86._0_4_ +
                             auVar21._16_4_ * auVar18._0_4_ + auVar22._16_4_ * auVar19._0_4_);
        auVar163._20_4_ =
             uVar144 ^ (uint)(auVar20._20_4_ * auVar86._4_4_ +
                             auVar21._20_4_ * auVar18._4_4_ + auVar22._20_4_ * auVar19._4_4_);
        auVar163._24_4_ =
             uVar146 ^ (uint)(auVar20._24_4_ * auVar86._8_4_ +
                             auVar21._24_4_ * auVar18._8_4_ + auVar22._24_4_ * auVar19._8_4_);
        auVar163._28_4_ = uVar148 ^ (uint)(auVar86._12_4_ + auVar21._28_4_ + auVar19._12_4_);
        auVar20 = vcmpps_avx(auVar163,_DAT_02020f00,5);
        auVar21 = auVar88 & auVar20;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar82._8_4_ = 0x7fffffff;
          auVar82._0_8_ = 0x7fffffff7fffffff;
          auVar82._12_4_ = 0x7fffffff;
          auVar82._16_4_ = 0x7fffffff;
          auVar82._20_4_ = 0x7fffffff;
          auVar82._24_4_ = 0x7fffffff;
          auVar82._28_4_ = 0x7fffffff;
          auVar21 = vandps_avx(auVar187,auVar82);
          auVar88 = vandps_avx(auVar20,auVar88);
          auVar20 = vsubps_avx(auVar21,auVar188);
          auVar20 = vcmpps_avx(auVar20,auVar163,5);
          auVar22 = auVar88 & auVar20;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar88 = vandps_avx(auVar20,auVar88);
            fVar3 = auVar116._28_4_;
            auVar102._0_4_ =
                 uVar129 ^ (uint)(fVar156 * fVar120 + fVar109 * fVar8 + fVar11 * fVar137);
            auVar102._4_4_ =
                 uVar136 ^ (uint)(fVar159 * fVar124 + fVar110 * fVar14 + fVar16 * fVar139);
            auVar102._8_4_ = uVar138 ^ (uint)(fVar112 * fVar125 + fVar111 * fVar6 + fVar7 * fVar141)
            ;
            auVar102._12_4_ =
                 uVar140 ^ (uint)(auVar149._12_4_ * fVar126 +
                                 auVar155._12_4_ * fVar9 + fVar10 * fVar143);
            auVar102._16_4_ =
                 uVar142 ^ (uint)(fVar156 * fVar127 + fVar109 * fVar12 + fVar11 * fVar145);
            auVar102._20_4_ =
                 uVar144 ^ (uint)(fVar159 * fVar128 + fVar110 * fVar15 + fVar16 * fVar147);
            auVar102._24_4_ =
                 uVar146 ^ (uint)(fVar112 * fVar93 + fVar111 * fVar17 + fVar7 * fVar160);
            auVar102._28_4_ = uVar148 ^ (uint)(fVar3 + fVar3 + auVar18._12_4_);
            auVar45._4_4_ = auVar21._4_4_ * local_5b40._4_4_;
            auVar45._0_4_ = auVar21._0_4_ * (float)local_5b40;
            auVar45._8_4_ = auVar21._8_4_ * (float)uStack_5b38;
            auVar45._12_4_ = auVar21._12_4_ * uStack_5b38._4_4_;
            auVar45._16_4_ = auVar21._16_4_ * (float)uStack_5b30;
            auVar45._20_4_ = auVar21._20_4_ * uStack_5b30._4_4_;
            auVar45._24_4_ = auVar21._24_4_ * (float)uStack_5b28;
            auVar45._28_4_ = fVar3;
            auVar116 = vcmpps_avx(auVar45,auVar102,1);
            auVar46._4_4_ = auVar21._4_4_ * local_5b60._4_4_;
            auVar46._0_4_ = auVar21._0_4_ * (float)local_5b60;
            auVar46._8_4_ = auVar21._8_4_ * (float)uStack_5b58;
            auVar46._12_4_ = auVar21._12_4_ * uStack_5b58._4_4_;
            auVar46._16_4_ = auVar21._16_4_ * (float)uStack_5b50;
            auVar46._20_4_ = auVar21._20_4_ * uStack_5b50._4_4_;
            auVar46._24_4_ = auVar21._24_4_ * (float)uStack_5b48;
            auVar46._28_4_ = auVar21._28_4_;
            auVar20 = vcmpps_avx(auVar102,auVar46,2);
            auVar116 = vandps_avx(auVar20,auVar116);
            auVar20 = auVar88 & auVar116;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar116,auVar88);
              auVar116 = vcmpps_avx(auVar187,_DAT_02020f00,4);
              auVar20 = auVar88 & auVar116;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                uVar129 = ((context->scene->geometries).items[uVar71].ptr)->mask;
                auVar103._4_4_ = uVar129;
                auVar103._0_4_ = uVar129;
                auVar103._8_4_ = uVar129;
                auVar103._12_4_ = uVar129;
                auVar103._16_4_ = uVar129;
                auVar103._20_4_ = uVar129;
                auVar103._24_4_ = uVar129;
                auVar103._28_4_ = uVar129;
                auVar88 = vandps_avx(auVar116,auVar88);
                auVar116 = vandps_avx(auVar103,*(undefined1 (*) [32])pRVar1);
                auVar149 = vpcmpeqd_avx(auVar116._16_16_,ZEXT816(0) << 0x20);
                auVar155 = vpcmpeqd_avx(auVar116._0_16_,ZEXT816(0) << 0x20);
                auVar104._16_16_ = auVar149;
                auVar104._0_16_ = auVar88._0_16_;
                auVar116 = vblendps_avx(ZEXT1632(auVar155),auVar104,0xf0);
                auVar20 = auVar88 & ~auVar116;
                if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0x7f,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0xbf,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar20[0x1f] < '\0') {
                  auVar88 = vandnps_avx(auVar116,auVar88);
                  auVar95 = vandnps_avx(auVar88,auVar95);
                }
              }
            }
          }
        }
      }
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0x7f,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0xbf,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f])
      {
        bVar77 = false;
      }
      else {
        uVar76 = *(undefined4 *)(lVar74 + -0x60 + uVar69 * 4);
        auVar101._4_4_ = uVar76;
        auVar101._0_4_ = uVar76;
        auVar101._8_4_ = uVar76;
        auVar101._12_4_ = uVar76;
        auVar101._16_4_ = uVar76;
        auVar101._20_4_ = uVar76;
        auVar101._24_4_ = uVar76;
        auVar101._28_4_ = uVar76;
        uVar76 = *(undefined4 *)(lVar74 + -0x50 + uVar69 * 4);
        auVar135._4_4_ = uVar76;
        auVar135._0_4_ = uVar76;
        auVar135._8_4_ = uVar76;
        auVar135._12_4_ = uVar76;
        auVar135._16_4_ = uVar76;
        auVar135._20_4_ = uVar76;
        auVar135._24_4_ = uVar76;
        auVar135._28_4_ = uVar76;
        fVar3 = *(float *)(lVar74 + -0x40 + uVar69 * 4);
        auVar153._4_4_ = fVar3;
        auVar153._0_4_ = fVar3;
        auVar153._8_4_ = fVar3;
        auVar153._12_4_ = fVar3;
        auVar153._16_4_ = fVar3;
        auVar153._20_4_ = fVar3;
        auVar153._24_4_ = fVar3;
        auVar153._28_4_ = fVar3;
        auVar116 = vsubps_avx(auVar101,_local_5c40);
        auVar20 = vsubps_avx(auVar135,_local_5c60);
        auVar64._4_4_ = local_5840;
        auVar64._0_4_ = local_5840;
        auVar64._8_4_ = local_5840;
        auVar64._12_4_ = local_5840;
        auVar64._16_4_ = local_5840;
        auVar64._20_4_ = local_5840;
        auVar64._24_4_ = local_5840;
        auVar64._28_4_ = local_5840;
        _local_5c40 = vsubps_avx(auVar153,auVar64);
        auVar21 = vsubps_avx(_local_5be0,auVar101);
        auVar22 = vsubps_avx(_local_5c00,auVar135);
        auVar88 = vsubps_avx(_local_5c20,auVar153);
        fVar4 = auVar20._0_4_;
        fVar189 = auVar88._0_4_;
        fVar11 = auVar20._4_4_;
        fVar190 = auVar88._4_4_;
        auVar33._4_4_ = fVar190 * fVar11;
        auVar33._0_4_ = fVar189 * fVar4;
        fVar6 = auVar20._8_4_;
        fVar191 = auVar88._8_4_;
        auVar33._8_4_ = fVar191 * fVar6;
        fVar12 = auVar20._12_4_;
        fVar192 = auVar88._12_4_;
        auVar33._12_4_ = fVar192 * fVar12;
        fVar156 = auVar20._16_4_;
        fVar193 = auVar88._16_4_;
        auVar33._16_4_ = fVar193 * fVar156;
        fVar120 = auVar20._20_4_;
        fVar194 = auVar88._20_4_;
        auVar33._20_4_ = fVar194 * fVar120;
        fVar126 = auVar20._24_4_;
        fVar195 = auVar88._24_4_;
        auVar33._24_4_ = fVar195 * fVar126;
        auVar33._28_4_ = auVar95._28_4_;
        fVar5 = local_5c40._0_4_;
        fVar179 = auVar22._0_4_;
        fVar14 = local_5c40._4_4_;
        fVar181 = auVar22._4_4_;
        auVar34._4_4_ = fVar181 * fVar14;
        auVar34._0_4_ = fVar179 * fVar5;
        fVar7 = local_5c40._8_4_;
        fVar182 = auVar22._8_4_;
        auVar34._8_4_ = fVar182 * fVar7;
        fVar15 = local_5c40._12_4_;
        fVar183 = auVar22._12_4_;
        auVar34._12_4_ = fVar183 * fVar15;
        fVar159 = local_5c40._16_4_;
        fVar184 = auVar22._16_4_;
        auVar34._16_4_ = fVar184 * fVar159;
        fVar124 = local_5c40._20_4_;
        fVar185 = auVar22._20_4_;
        auVar34._20_4_ = fVar185 * fVar124;
        fVar127 = local_5c40._24_4_;
        fVar186 = auVar22._24_4_;
        auVar34._24_4_ = fVar186 * fVar127;
        auVar34._28_4_ = local_5c20._4_4_;
        auVar79 = vsubps_avx(auVar34,auVar33);
        fVar170 = auVar21._0_4_;
        fVar173 = auVar21._4_4_;
        auVar35._4_4_ = fVar173 * fVar14;
        auVar35._0_4_ = fVar170 * fVar5;
        fVar174 = auVar21._8_4_;
        auVar35._8_4_ = fVar174 * fVar7;
        fVar175 = auVar21._12_4_;
        auVar35._12_4_ = fVar175 * fVar15;
        fVar176 = auVar21._16_4_;
        auVar35._16_4_ = fVar176 * fVar159;
        fVar177 = auVar21._20_4_;
        auVar35._20_4_ = fVar177 * fVar124;
        fVar178 = auVar21._24_4_;
        auVar35._24_4_ = fVar178 * fVar127;
        auVar35._28_4_ = local_5c20._4_4_;
        fVar8 = auVar116._0_4_;
        fVar16 = auVar116._4_4_;
        auVar36._4_4_ = fVar190 * fVar16;
        auVar36._0_4_ = fVar189 * fVar8;
        fVar9 = auVar116._8_4_;
        auVar36._8_4_ = fVar191 * fVar9;
        fVar17 = auVar116._12_4_;
        auVar36._12_4_ = fVar192 * fVar17;
        fVar13 = auVar116._16_4_;
        auVar36._16_4_ = fVar193 * fVar13;
        fVar125 = auVar116._20_4_;
        auVar36._20_4_ = fVar194 * fVar125;
        fVar128 = auVar116._24_4_;
        auVar36._24_4_ = fVar195 * fVar128;
        auVar36._28_4_ = local_5c40._28_4_;
        auVar117 = vsubps_avx(auVar36,auVar35);
        auVar37._4_4_ = fVar181 * fVar16;
        auVar37._0_4_ = fVar179 * fVar8;
        auVar37._8_4_ = fVar182 * fVar9;
        auVar37._12_4_ = fVar183 * fVar17;
        auVar37._16_4_ = fVar184 * fVar13;
        auVar37._20_4_ = fVar185 * fVar125;
        auVar37._24_4_ = fVar186 * fVar128;
        auVar37._28_4_ = local_5c40._28_4_;
        auVar38._4_4_ = fVar173 * fVar11;
        auVar38._0_4_ = fVar170 * fVar4;
        auVar38._8_4_ = fVar174 * fVar6;
        auVar38._12_4_ = fVar175 * fVar12;
        auVar38._16_4_ = fVar176 * fVar156;
        auVar38._20_4_ = fVar177 * fVar120;
        auVar38._24_4_ = fVar178 * fVar126;
        auVar38._28_4_ = auVar116._28_4_;
        _local_5c20 = vsubps_avx(auVar38,auVar37);
        auVar118 = vsubps_avx(auVar101,*(undefined1 (*) [32])ray);
        auVar88 = vsubps_avx(auVar135,*(undefined1 (*) [32])pRVar73);
        auVar122 = vsubps_avx(auVar153,*(undefined1 (*) [32])pRVar2);
        fVar160 = auVar122._0_4_;
        fVar164 = auVar122._4_4_;
        auVar39._4_4_ = fVar164 * fStack_5adc;
        auVar39._0_4_ = fVar160 * local_5ae0;
        fVar165 = auVar122._8_4_;
        auVar39._8_4_ = fVar165 * fStack_5ad8;
        fVar166 = auVar122._12_4_;
        auVar39._12_4_ = fVar166 * fStack_5ad4;
        fVar167 = auVar122._16_4_;
        auVar39._16_4_ = fVar167 * fStack_5ad0;
        fVar168 = auVar122._20_4_;
        auVar39._20_4_ = fVar168 * fStack_5acc;
        fVar169 = auVar122._24_4_;
        auVar39._24_4_ = fVar169 * fStack_5ac8;
        auVar39._28_4_ = fVar3;
        fVar130 = auVar88._0_4_;
        fVar137 = auVar88._4_4_;
        auVar40._4_4_ = fVar137 * local_5b00._4_4_;
        auVar40._0_4_ = fVar130 * (float)local_5b00;
        fVar139 = auVar88._8_4_;
        auVar40._8_4_ = fVar139 * (float)uStack_5af8;
        fVar141 = auVar88._12_4_;
        auVar40._12_4_ = fVar141 * uStack_5af8._4_4_;
        fVar143 = auVar88._16_4_;
        auVar40._16_4_ = fVar143 * (float)uStack_5af0;
        fVar145 = auVar88._20_4_;
        auVar40._20_4_ = fVar145 * uStack_5af0._4_4_;
        fVar147 = auVar88._24_4_;
        auVar40._24_4_ = fVar147 * (float)uStack_5ae8;
        auVar40._28_4_ = auVar20._28_4_;
        auVar122 = vsubps_avx(auVar40,auVar39);
        fVar93 = auVar118._0_4_;
        fVar109 = auVar118._4_4_;
        auVar41._4_4_ = fVar109 * local_5b00._4_4_;
        auVar41._0_4_ = fVar93 * (float)local_5b00;
        fVar110 = auVar118._8_4_;
        auVar41._8_4_ = fVar110 * (float)uStack_5af8;
        fVar111 = auVar118._12_4_;
        auVar41._12_4_ = fVar111 * uStack_5af8._4_4_;
        fVar112 = auVar118._16_4_;
        auVar41._16_4_ = fVar112 * (float)uStack_5af0;
        fVar113 = auVar118._20_4_;
        auVar41._20_4_ = fVar113 * uStack_5af0._4_4_;
        fVar114 = auVar118._24_4_;
        auVar41._24_4_ = fVar114 * (float)uStack_5ae8;
        auVar41._28_4_ = fVar3;
        auVar42._4_4_ = fVar164 * local_5b20._4_4_;
        auVar42._0_4_ = fVar160 * (float)local_5b20;
        auVar42._8_4_ = fVar165 * (float)uStack_5b18;
        auVar42._12_4_ = fVar166 * uStack_5b18._4_4_;
        auVar42._16_4_ = fVar167 * (float)uStack_5b10;
        auVar42._20_4_ = fVar168 * uStack_5b10._4_4_;
        auVar42._24_4_ = fVar169 * (float)uStack_5b08;
        auVar42._28_4_ = auVar188._28_4_;
        auVar132 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = fVar137 * local_5b20._4_4_;
        auVar43._0_4_ = fVar130 * (float)local_5b20;
        auVar43._8_4_ = fVar139 * (float)uStack_5b18;
        auVar43._12_4_ = fVar141 * uStack_5b18._4_4_;
        auVar43._16_4_ = fVar143 * (float)uStack_5b10;
        auVar43._20_4_ = fVar145 * uStack_5b10._4_4_;
        auVar43._24_4_ = fVar147 * (float)uStack_5b08;
        auVar43._28_4_ = fVar3;
        auVar44._4_4_ = fVar109 * fStack_5adc;
        auVar44._0_4_ = fVar93 * local_5ae0;
        auVar44._8_4_ = fVar110 * fStack_5ad8;
        auVar44._12_4_ = fVar111 * fStack_5ad4;
        auVar44._16_4_ = fVar112 * fStack_5ad0;
        auVar44._20_4_ = fVar113 * fStack_5acc;
        auVar44._24_4_ = fVar114 * fStack_5ac8;
        auVar44._28_4_ = fVar10;
        auVar133 = vsubps_avx(auVar44,auVar43);
        auVar154._0_4_ =
             auVar79._0_4_ * (float)local_5b20 +
             local_5ae0 * auVar117._0_4_ + local_5c20._0_4_ * (float)local_5b00;
        auVar154._4_4_ =
             auVar79._4_4_ * local_5b20._4_4_ +
             fStack_5adc * auVar117._4_4_ + local_5c20._4_4_ * local_5b00._4_4_;
        auVar154._8_4_ =
             auVar79._8_4_ * (float)uStack_5b18 +
             fStack_5ad8 * auVar117._8_4_ + local_5c20._8_4_ * (float)uStack_5af8;
        auVar154._12_4_ =
             auVar79._12_4_ * uStack_5b18._4_4_ +
             fStack_5ad4 * auVar117._12_4_ + local_5c20._12_4_ * uStack_5af8._4_4_;
        auVar154._16_4_ =
             auVar79._16_4_ * (float)uStack_5b10 +
             fStack_5ad0 * auVar117._16_4_ + local_5c20._16_4_ * (float)uStack_5af0;
        auVar154._20_4_ =
             auVar79._20_4_ * uStack_5b10._4_4_ +
             fStack_5acc * auVar117._20_4_ + local_5c20._20_4_ * uStack_5af0._4_4_;
        auVar154._24_4_ =
             auVar79._24_4_ * (float)uStack_5b08 +
             fStack_5ac8 * auVar117._24_4_ + local_5c20._24_4_ * (float)uStack_5ae8;
        auVar154._28_4_ = fVar3 + fStack_5ac4 + fVar3;
        auVar180._8_4_ = 0x80000000;
        auVar180._0_8_ = 0x8000000080000000;
        auVar180._12_4_ = 0x80000000;
        auVar180._16_4_ = 0x80000000;
        auVar180._20_4_ = 0x80000000;
        auVar180._24_4_ = 0x80000000;
        auVar180._28_4_ = 0x80000000;
        auVar88 = vandps_avx(auVar180,auVar154);
        uVar129 = auVar88._0_4_;
        auVar172._0_4_ =
             uVar129 ^ (uint)(fVar170 * auVar122._0_4_ +
                             fVar179 * auVar132._0_4_ + fVar189 * auVar133._0_4_);
        uVar136 = auVar88._4_4_;
        auVar172._4_4_ =
             uVar136 ^ (uint)(fVar173 * auVar122._4_4_ +
                             fVar181 * auVar132._4_4_ + fVar190 * auVar133._4_4_);
        uVar138 = auVar88._8_4_;
        auVar172._8_4_ =
             uVar138 ^ (uint)(fVar174 * auVar122._8_4_ +
                             fVar182 * auVar132._8_4_ + fVar191 * auVar133._8_4_);
        uVar140 = auVar88._12_4_;
        auVar172._12_4_ =
             uVar140 ^ (uint)(fVar175 * auVar122._12_4_ +
                             fVar183 * auVar132._12_4_ + fVar192 * auVar133._12_4_);
        uVar142 = auVar88._16_4_;
        auVar172._16_4_ =
             uVar142 ^ (uint)(fVar176 * auVar122._16_4_ +
                             fVar184 * auVar132._16_4_ + fVar193 * auVar133._16_4_);
        uVar144 = auVar88._20_4_;
        auVar172._20_4_ =
             uVar144 ^ (uint)(fVar177 * auVar122._20_4_ +
                             fVar185 * auVar132._20_4_ + fVar194 * auVar133._20_4_);
        uVar146 = auVar88._24_4_;
        auVar172._24_4_ =
             uVar146 ^ (uint)(fVar178 * auVar122._24_4_ +
                             fVar186 * auVar132._24_4_ + fVar195 * auVar133._24_4_);
        uVar148 = auVar88._28_4_;
        auVar172._28_4_ = uVar148 ^ (uint)(auVar21._28_4_ + auVar22._28_4_ + fStack_5ac4 + fVar3);
        auVar88 = vcmpps_avx(auVar172,_DAT_02020f00,5);
        auVar21 = auVar95 & auVar88;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar88 = vandps_avx(auVar88,auVar95);
          fVar3 = auVar79._28_4_;
          auVar158._0_4_ =
               uVar129 ^ (uint)(auVar122._0_4_ * fVar8 +
                               auVar132._0_4_ * fVar4 + auVar133._0_4_ * fVar5);
          auVar158._4_4_ =
               uVar136 ^ (uint)(auVar122._4_4_ * fVar16 +
                               auVar132._4_4_ * fVar11 + auVar133._4_4_ * fVar14);
          auVar158._8_4_ =
               uVar138 ^ (uint)(auVar122._8_4_ * fVar9 +
                               auVar132._8_4_ * fVar6 + auVar133._8_4_ * fVar7);
          auVar158._12_4_ =
               uVar140 ^ (uint)(auVar122._12_4_ * fVar17 +
                               auVar132._12_4_ * fVar12 + auVar133._12_4_ * fVar15);
          auVar158._16_4_ =
               uVar142 ^ (uint)(auVar122._16_4_ * fVar13 +
                               auVar132._16_4_ * fVar156 + auVar133._16_4_ * fVar159);
          auVar158._20_4_ =
               uVar144 ^ (uint)(auVar122._20_4_ * fVar125 +
                               auVar132._20_4_ * fVar120 + auVar133._20_4_ * fVar124);
          auVar158._24_4_ =
               uVar146 ^ (uint)(auVar122._24_4_ * fVar128 +
                               auVar132._24_4_ * fVar126 + auVar133._24_4_ * fVar127);
          auVar158._28_4_ = uVar148 ^ (uint)(auVar117._28_4_ + fVar3 + auVar95._28_4_);
          auVar21 = vcmpps_avx(auVar158,_DAT_02020f00,5);
          auVar22 = auVar88 & auVar21;
          _local_5c60 = auVar117;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar83._8_4_ = 0x7fffffff;
            auVar83._0_8_ = 0x7fffffff7fffffff;
            auVar83._12_4_ = 0x7fffffff;
            auVar83._16_4_ = 0x7fffffff;
            auVar83._20_4_ = 0x7fffffff;
            auVar83._24_4_ = 0x7fffffff;
            auVar83._28_4_ = 0x7fffffff;
            auVar22 = vandps_avx(auVar154,auVar83);
            auVar88 = vandps_avx(auVar21,auVar88);
            auVar122 = vsubps_avx(auVar22,auVar172);
            auVar21 = vcmpps_avx(auVar122,auVar158,5);
            auVar132 = auVar88 & auVar21;
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar132 >> 0x7f,0) != '\0') ||
                  (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0xbf,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar132[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar21,auVar88);
              auVar84._0_4_ =
                   uVar129 ^ (uint)(auVar79._0_4_ * fVar93 +
                                   local_5c20._0_4_ * fVar160 + fVar130 * auVar117._0_4_);
              auVar84._4_4_ =
                   uVar136 ^ (uint)(auVar79._4_4_ * fVar109 +
                                   local_5c20._4_4_ * fVar164 + fVar137 * auVar117._4_4_);
              auVar84._8_4_ =
                   uVar138 ^ (uint)(auVar79._8_4_ * fVar110 +
                                   local_5c20._8_4_ * fVar165 + fVar139 * auVar117._8_4_);
              auVar84._12_4_ =
                   uVar140 ^ (uint)(auVar79._12_4_ * fVar111 +
                                   local_5c20._12_4_ * fVar166 + fVar141 * auVar117._12_4_);
              auVar84._16_4_ =
                   uVar142 ^ (uint)(auVar79._16_4_ * fVar112 +
                                   local_5c20._16_4_ * fVar167 + fVar143 * auVar117._16_4_);
              auVar84._20_4_ =
                   uVar144 ^ (uint)(auVar79._20_4_ * fVar113 +
                                   local_5c20._20_4_ * fVar168 + fVar145 * auVar117._20_4_);
              auVar84._24_4_ =
                   uVar146 ^ (uint)(auVar79._24_4_ * fVar114 +
                                   local_5c20._24_4_ * fVar169 + fVar147 * auVar117._24_4_);
              auVar84._28_4_ = uVar148 ^ (uint)(fVar3 + auVar122._28_4_ + fVar3);
              auVar47._4_4_ = auVar22._4_4_ * local_5b40._4_4_;
              auVar47._0_4_ = auVar22._0_4_ * (float)local_5b40;
              auVar47._8_4_ = auVar22._8_4_ * (float)uStack_5b38;
              auVar47._12_4_ = auVar22._12_4_ * uStack_5b38._4_4_;
              auVar47._16_4_ = auVar22._16_4_ * (float)uStack_5b30;
              auVar47._20_4_ = auVar22._20_4_ * uStack_5b30._4_4_;
              auVar47._24_4_ = auVar22._24_4_ * (float)uStack_5b28;
              auVar47._28_4_ = fVar3;
              auVar21 = vcmpps_avx(auVar47,auVar84,1);
              auVar48._4_4_ = auVar22._4_4_ * local_5b60._4_4_;
              auVar48._0_4_ = auVar22._0_4_ * (float)local_5b60;
              auVar48._8_4_ = auVar22._8_4_ * (float)uStack_5b58;
              auVar48._12_4_ = auVar22._12_4_ * uStack_5b58._4_4_;
              auVar48._16_4_ = auVar22._16_4_ * (float)uStack_5b50;
              auVar48._20_4_ = auVar22._20_4_ * uStack_5b50._4_4_;
              auVar48._24_4_ = auVar22._24_4_ * (float)uStack_5b48;
              auVar48._28_4_ = auVar118._28_4_;
              auVar22 = vcmpps_avx(auVar84,auVar48,2);
              auVar21 = vandps_avx(auVar22,auVar21);
              auVar22 = auVar88 & auVar21;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar88 = vandps_avx(auVar88,auVar21);
                auVar21 = vcmpps_avx(auVar154,_DAT_02020f00,4);
                auVar22 = auVar88 & auVar21;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0x7f,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar22[0x1f] < '\0') {
                  uVar129 = ((context->scene->geometries).items[uVar71].ptr)->mask;
                  auVar105._4_4_ = uVar129;
                  auVar105._0_4_ = uVar129;
                  auVar105._8_4_ = uVar129;
                  auVar105._12_4_ = uVar129;
                  auVar105._16_4_ = uVar129;
                  auVar105._20_4_ = uVar129;
                  auVar105._24_4_ = uVar129;
                  auVar105._28_4_ = uVar129;
                  auVar88 = vandps_avx(auVar21,auVar88);
                  auVar21 = vandps_avx(auVar105,*(undefined1 (*) [32])pRVar1);
                  auVar149 = vpcmpeqd_avx(auVar21._16_16_,ZEXT816(0) << 0x20);
                  auVar155 = vpcmpeqd_avx(auVar21._0_16_,ZEXT816(0) << 0x20);
                  auVar106._16_16_ = auVar149;
                  auVar106._0_16_ = auVar88._0_16_;
                  auVar21 = vblendps_avx(ZEXT1632(auVar155),auVar106,0xf0);
                  auVar22 = auVar88 & ~auVar21;
                  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0x7f,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0xbf,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar22[0x1f] < '\0') {
                    auVar88 = vandnps_avx(auVar21,auVar88);
                    auVar95 = vandnps_avx(auVar88,auVar95);
                  }
                }
              }
            }
          }
        }
        bVar77 = (((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar95 >> 0x7f,0) != '\0') ||
                   (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar95 >> 0xbf,0) != '\0') ||
                 (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar95[0x1f] < '\0';
        _local_5c00 = auVar20;
        _local_5be0 = auVar116;
      }
      fStack_583c = local_5840;
      fStack_5838 = local_5840;
      fStack_5834 = local_5840;
      fStack_5830 = local_5840;
      fStack_582c = local_5840;
      fStack_5828 = local_5840;
      fStack_5824 = local_5840;
      if ((!bVar77) || (bVar77 = 2 < uVar69, uVar69 = uVar69 + 1, bVar77)) break;
    }
    auVar149 = local_5cc0._0_16_;
    auVar99 = vandps_avx(auVar95,local_5cc0);
    auVar95 = local_5cc0 & auVar95;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f])
    break;
  }
  auVar85._0_8_ = auVar99._0_8_ ^ 0xffffffffffffffff;
  auVar85._8_4_ = auVar99._8_4_ ^ 0xffffffff;
  auVar85._12_4_ = auVar99._12_4_ ^ 0xffffffff;
  auVar85._16_4_ = auVar99._16_4_ ^ 0xffffffff;
  auVar85._20_4_ = auVar99._20_4_ ^ 0xffffffff;
  auVar85._24_4_ = auVar99._24_4_ ^ 0xffffffff;
  auVar85._28_4_ = auVar99._28_4_ ^ 0xffffffff;
  unaff_R15 = local_5ca0;
  local_5b60 = uVar58;
  uStack_5b58 = uVar59;
  uStack_5b50 = uVar60;
  local_5b40 = uVar49;
  uStack_5b38 = uVar50;
  uStack_5b30 = uVar51;
  local_5b20 = uVar55;
  uStack_5b18 = uVar56;
  uStack_5b10 = uVar57;
  local_5b00 = uVar52;
  uStack_5af8 = uVar53;
  uStack_5af0 = uVar54;
LAB_00486168:
  _local_5c80 = vorps_avx(_local_5c80,auVar85);
  auVar149 = vpcmpeqd_avx(auVar149,auVar149);
  auVar155 = vpcmpgtd_avx(local_5c80._16_16_,auVar149);
  auVar149 = vpcmpgtd_avx(local_5c80._0_16_,auVar149);
  auVar149 = vpor_avx(auVar149,auVar155);
  if ((((auVar149 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar149 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar149 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar149[0xf]) {
LAB_004861b7:
    iVar66 = 3;
  }
  else {
    auVar91._8_4_ = 0xff800000;
    auVar91._0_8_ = 0xff800000ff800000;
    auVar91._12_4_ = 0xff800000;
    auVar91._16_4_ = 0xff800000;
    auVar91._20_4_ = 0xff800000;
    auVar91._24_4_ = 0xff800000;
    auVar91._28_4_ = 0xff800000;
    local_58c0 = vblendvps_avx(local_58c0,auVar91,_local_5c80);
    iVar66 = 0;
  }
LAB_004861ba:
  if (iVar66 == 3) {
    auVar95 = vandps_avx(local_5880,_local_5c80);
    auVar92._8_4_ = 0xff800000;
    auVar92._0_8_ = 0xff800000ff800000;
    auVar92._12_4_ = 0xff800000;
    auVar92._16_4_ = 0xff800000;
    auVar92._20_4_ = 0xff800000;
    auVar92._24_4_ = 0xff800000;
    auVar92._28_4_ = 0xff800000;
    auVar95 = vmaskmovps_avx(auVar95,auVar92);
    *(undefined1 (*) [32])local_5ca0 = auVar95;
    return;
  }
  goto LAB_0048571a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }